

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_poly_vector.h
# Opt level: O3

void __thiscall
Impl2T<poly::delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>_>
::~Impl2T(Impl2T<poly::delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>_>
          *this)

{
  double *pdVar1;
  elem_ptr_pointer pvVar2;
  elem_ptr_pointer pvVar3;
  
  (this->super_Interface)._vptr_Interface = (_func_int **)&PTR_function_002b4c48;
  Cookie::~Cookie(&this->cookie);
  pdVar1 = (this->p)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
           super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
           super__Head_base<0UL,_double_*,_false>._M_head_impl;
  if (pdVar1 != (double *)0x0) {
    operator_delete__(pdVar1);
  }
  (this->p)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl = (double *)0x0;
  pvVar3 = (elem_ptr_pointer)(this->v).super_allocator_base<std::allocator<unsigned_char>_>._storage
  ;
  pvVar2 = (this->v)._free_elem;
  if (pvVar2 != pvVar3) {
    do {
      (*((pvVar3->ptr).second)->_vptr_Interface[3])();
      (pvVar3->ptr).second = (Interface *)0x0;
      (pvVar3->sf).first = 0;
      (pvVar3->
      super_CloningPolicyHolder<poly::delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>,_std::integral_constant<bool,_true>_>
      ).
      super_delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>
      .cf = (clone_func_ptr_t)0x0;
      (pvVar3->ptr).first = (void *)0x0;
      (pvVar3->sf).second = 0;
      pvVar3 = pvVar3 + 1;
    } while (pvVar3 != pvVar2);
    pvVar3 = (elem_ptr_pointer)
             (this->v).super_allocator_base<std::allocator<unsigned_char>_>._storage;
  }
  (this->v)._align_max = 8;
  pvVar2 = pvVar3;
  if (((ulong)((long)(this->v)._begin_storage - (long)pvVar3) / 5 & 0xfffffffffffffff8) * 5 != 0) {
    do {
      (pvVar2->sf).first = 0;
      (pvVar2->sf).second = 0;
      (pvVar2->ptr).first = (void *)0x0;
      (pvVar2->ptr).second = (Interface *)0x0;
      pvVar2 = pvVar2 + 1;
      pvVar3 = (elem_ptr_pointer)
               (this->v).super_allocator_base<std::allocator<unsigned_char>_>._storage;
    } while (pvVar2 != pvVar3 + (ulong)((long)(this->v)._begin_storage - (long)pvVar3) / 0x28);
  }
  (this->v)._free_elem = (elem_ptr_pointer)0x0;
  (this->v)._begin_storage = (void_pointer)0x0;
  operator_delete(pvVar3,(long)(this->v).super_allocator_base<std::allocator<unsigned_char>_>.
                               _end_storage - (long)pvVar3);
  (this->v).super_allocator_base<std::allocator<unsigned_char>_>._storage = (void_pointer)0x0;
  (this->v).super_allocator_base<std::allocator<unsigned_char>_>._end_storage = (void_pointer)0x0;
  operator_delete((void *)0x0,0);
  operator_delete(this,0x100,0x40);
  return;
}

Assistant:

explicit Impl2T(bool throw_on_copy = false)
        : Interface { throw_on_copy }
        , p { new double[137] }
    {
        cookie.set();
    }